

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

string * ot::commissioner::utils::Hex<unsigned_short>
                   (string *__return_storage_ptr__,unsigned_short aInteger)

{
  ByteArray *aBytes;
  allocator local_69;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_30,"0x",&local_69);
  Encode<unsigned_short>((ByteArray *)&local_68,aInteger);
  Hex_abi_cxx11_(&local_50,(utils *)&local_68,aBytes);
  std::operator+(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string Hex(T aInteger)
{
    return std::string("0x") + Hex(Encode(aInteger));
}